

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall JetHead::vector<Regex::GroupData>::clear(vector<Regex::GroupData> *this)

{
  long *plVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = this->mSize;
  if (uVar2 != 0) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      plVar1 = *(long **)((long)this->mData + lVar4 + -0x10);
      plVar3 = (long *)((long)&this->mData->start_pos + lVar4);
      if (plVar3 != plVar1) {
        operator_delete(plVar1,*plVar3 + 1);
        uVar2 = this->mSize;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar5 < uVar2);
  }
  this->mSize = 0;
  return;
}

Assistant:

void clear() 
		{ 
			// Call destructor-in-place, not delete (we didn't
			// allocate this object with new).  Destroy everything.
			for (unsigned i = 0; i < mSize; i++)
			{
				mData[i].~T();
			}

			// Nothing is left
			mSize = 0; 
		}